

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

void __thiscall helics::MessageTimer::sendMessage(MessageTimer *this,int32_t timerIndex)

{
  bool bVar1;
  action_t aVar2;
  size_type sVar3;
  reference pvVar4;
  int in_ESI;
  long in_RDI;
  ActionMessage buf;
  unique_lock<std::mutex> lock;
  ActionMessage *in_stack_fffffffffffffee8;
  ActionMessage *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int iVar5;
  __unspec local_3d [13];
  undefined8 local_30;
  type local_21;
  int local_c;
  
  local_c = in_ESI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)in_stack_fffffffffffffee8);
  if ((-1 < local_c) &&
     (iVar5 = local_c,
     sVar3 = std::
             vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
             ::size((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                     *)(in_RDI + 0x88)), iVar5 < (int)sVar3)) {
    local_30 = std::chrono::_V2::steady_clock::now();
    std::
    vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
    ::operator[]((vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                  *)(in_RDI + 0x50),(long)local_c);
    local_21 = (type)std::chrono::
                     operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)CONCAT44(iVar5,in_stack_fffffffffffffef8),
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffffef0);
    CLI::std::__cmp_cat::__unspec::__unspec(local_3d,(__unspec *)0x0);
    bVar1 = std::operator>=(local_21);
    if (bVar1) {
      pvVar4 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
               operator[]((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                          (in_RDI + 0x38),(long)local_c);
      aVar2 = ActionMessage::action(pvVar4);
      if (aVar2 != cmd_ignore) {
        in_stack_fffffffffffffef0 = (ActionMessage *)(in_RDI + 0x38);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_fffffffffffffef0,(long)local_c);
        ActionMessage::ActionMessage(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        pvVar4 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                 operator[]((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *
                            )in_stack_fffffffffffffef0,(long)local_c);
        ActionMessage::setAction(pvVar4,cmd_ignore);
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffef0);
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffef0);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void MessageTimer::sendMessage(int32_t timerIndex)
{
    std::unique_lock<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        if (std::chrono::steady_clock::now() >= expirationTimes[timerIndex]) {
            if (buffers[timerIndex].action() != CMD_IGNORE) {
                ActionMessage buf = std::move(buffers[timerIndex]);
                buffers[timerIndex].setAction(CMD_IGNORE);  // clear out the action
                lock.unlock();  // don't keep a lock while calling a callback
                sendFunction(std::move(buf));
            }
        }
    }
}